

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::FormatString<std::__cxx11::string,char[19],unsigned_long,char[9]>
          (string *__return_storage_ptr__,Diligent *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args,
          char (*Args_1) [19],unsigned_long *Args_2,char (*Args_3) [9])

{
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,*(char **)this,*(long *)(this + 8));
  FormatStrSS<std::__cxx11::stringstream,char[19],unsigned_long,char[9]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (char (*) [19])Args,(unsigned_long *)Args_1,(char (*) [9])Args_2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}